

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

Strategy boost::deflate::deflate_stream_test::toStrategy(int strategy)

{
  Strategy SVar1;
  
  SVar1 = normal;
  if (strategy - 1U < 4) {
    SVar1 = strategy;
  }
  return SVar1;
}

Assistant:

static
    Strategy toStrategy(int strategy)
    {
        switch(strategy)
        {
        default:
        case 0: return Strategy::normal;
        case 1: return Strategy::filtered;
        case 2: return Strategy::huffman;
        case 3: return Strategy::rle;
        case 4: return Strategy::fixed;
        }
    }